

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive-list.h
# Opt level: O0

iterator __thiscall
wabt::intrusive_list<wabt::Expr>::insert
          (intrusive_list<wabt::Expr> *this,iterator pos,
          unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *node)

{
  pointer pEVar1;
  pointer pEVar2;
  reference pEVar3;
  bool bVar4;
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> local_58;
  iterator local_50;
  pointer local_40;
  Expr *node_p;
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *node_local;
  intrusive_list<wabt::Expr> *this_local;
  iterator pos_local;
  
  pos_local.list_ = (intrusive_list<wabt::Expr> *)pos.node_;
  this_local = pos.list_;
  node_p = (Expr *)node;
  node_local = (unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)this;
  pEVar1 = std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::operator->(node);
  bVar4 = false;
  if ((pEVar1->super_intrusive_list_base<wabt::Expr>).prev_ == (Expr *)0x0) {
    pEVar1 = std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::operator->(node);
    bVar4 = (pEVar1->super_intrusive_list_base<wabt::Expr>).next_ == (Expr *)0x0;
  }
  if (!bVar4) {
    __assert_fail("node->prev_ == nullptr && node->next_ == nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/intrusive-list.h"
                  ,0x203,
                  "typename intrusive_list<T>::iterator wabt::intrusive_list<wabt::Expr>::insert(iterator, std::unique_ptr<T>) [T = wabt::Expr]"
                 );
  }
  local_50 = end(this);
  bVar4 = iterator::operator==((iterator *)&this_local,local_50);
  if (bVar4) {
    std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::unique_ptr(&local_58,node);
    push_back(this,&local_58);
    std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::~unique_ptr(&local_58);
    local_40 = back(this);
  }
  else {
    local_40 = std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::release(node);
    pEVar2 = iterator::operator->((iterator *)&this_local);
    (local_40->super_intrusive_list_base<wabt::Expr>).prev_ =
         (pEVar2->super_intrusive_list_base<wabt::Expr>).prev_;
    pEVar3 = iterator::operator*((iterator *)&this_local);
    (local_40->super_intrusive_list_base<wabt::Expr>).next_ = pEVar3;
    pEVar2 = iterator::operator->((iterator *)&this_local);
    pEVar1 = local_40;
    if ((pEVar2->super_intrusive_list_base<wabt::Expr>).prev_ == (Expr *)0x0) {
      this->first_ = local_40;
    }
    else {
      pEVar2 = iterator::operator->((iterator *)&this_local);
      (((pEVar2->super_intrusive_list_base<wabt::Expr>).prev_)->
      super_intrusive_list_base<wabt::Expr>).next_ = pEVar1;
    }
    pEVar1 = local_40;
    pEVar2 = iterator::operator->((iterator *)&this_local);
    (pEVar2->super_intrusive_list_base<wabt::Expr>).prev_ = pEVar1;
    this->size_ = this->size_ + 1;
  }
  iterator::iterator((iterator *)&pos_local.node_,this,local_40);
  return stack0xffffffffffffffe8;
}

Assistant:

inline typename intrusive_list<T>::iterator intrusive_list<T>::insert(
    iterator pos,
    std::unique_ptr<T> node) {
  assert(node->prev_ == nullptr && node->next_ == nullptr);

  T* node_p;
  if (pos == end()) {
    push_back(std::move(node));
    node_p = &back();
  } else {
    node_p = node.release();
    node_p->prev_ = pos->prev_;
    node_p->next_ = &*pos;
    if (pos->prev_) {
      pos->prev_->next_ = node_p;
    } else {
      first_ = node_p;
    }
    pos->prev_ = node_p;
    size_++;
  }
  return iterator(*this, node_p);
}